

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O1

MauResult __thiscall
mau::ProxySession::Inject(ProxySession *this,uint16_t sourcePort,void *datagram,uint bytes)

{
  BufferAllocator *__mutex;
  ostringstream *poVar1;
  uint16_t uVar2;
  int iVar3;
  QueueNode *node;
  OutputWorker *pOVar4;
  MauResult MVar5;
  pthread_mutex_t *__mutex_00;
  UDPAddress serverAddress;
  address local_240;
  data_union local_21c;
  pthread_mutex_t *local_200;
  string local_1f8;
  basic_endpoint<asio::ip::udp> local_1d4;
  undefined1 local_1b8 [392];
  
  __mutex_00 = (pthread_mutex_t *)&this->APILock;
  iVar3 = pthread_mutex_lock(__mutex_00);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  MVar5 = Mau_Success;
  if ((((this->Terminated)._M_base._M_i & 1U) != 0) ||
     (MVar5 = Mau_InvalidInput,
     (this->super_DeliveryCommonData).ProxyConfig.MaxDatagramBytes < bytes)) goto LAB_00109cf5;
  __mutex = &(this->super_DeliveryCommonData).ReadBufferAllocator;
  local_200 = __mutex_00;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  node = (QueueNode *)
         pktalloc::Allocator::Allocate
                   (&(this->super_DeliveryCommonData).ReadBufferAllocator.Allocator,bytes + 0x1c);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  node->Bytes = bytes;
  memcpy(node->Data,datagram,(ulong)bytes);
  LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Get(&local_1d4,&this->ServerAddress);
  uVar2 = swap_bytes(local_1d4.impl_.data_.v4.sin_port);
  if (uVar2 == sourcePort) {
    DeliveryChannel::InsertQueueNode(&this->S2C,node);
  }
  else {
    LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Get
              ((basic_endpoint<asio::ip::udp> *)&local_21c.base,&this->ClientAddress);
    if (local_21c.v4.sin_port == 0) {
      local_21c.base.sa_family = 2;
      local_21c.v4.sin_port = swap_bytes(sourcePort);
      local_21c.v6.sin6_flowinfo = 0x100007f;
      local_21c.base.sa_data[6] = '\0';
      local_21c.base.sa_data[7] = '\0';
      local_21c.base.sa_data[8] = '\0';
      local_21c.base.sa_data[9] = '\0';
      local_21c.base.sa_data[10] = '\0';
      local_21c.base.sa_data[0xb] = '\0';
      local_21c.base.sa_data[0xc] = '\0';
      local_21c.base.sa_data[0xd] = '\0';
      local_21c._16_8_ = 0;
      local_21c.v6.sin6_scope_id = 0;
      LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Set
                (&this->ClientAddress,(basic_endpoint<asio::ip::udp> *)&local_21c.base);
      LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Set
                (&(this->S2C).DeliveryAddress,(basic_endpoint<asio::ip::udp> *)&local_21c.base);
      DeliveryChannel::InsertQueueNode(&this->C2S,node);
      if (local_21c.base.sa_family == 2) {
        local_240._0_8_ = (ulong)local_21c.v6.sin6_flowinfo << 0x20;
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
        local_240.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_240.ipv6_address_.scope_id_ = 0;
      }
      else {
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = local_21c.base.sa_data[6];
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = local_21c.base.sa_data[7];
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = local_21c.base.sa_data[8];
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = local_21c.base.sa_data[9];
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = local_21c.base.sa_data[10];
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = local_21c.base.sa_data[0xb];
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = local_21c.base.sa_data[0xc];
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = local_21c.base.sa_data[0xd];
        local_240.ipv6_address_.addr_.__in6_u._8_8_ = local_21c._16_8_;
        local_240.ipv6_address_.scope_id_ = (unsigned_long)local_21c.v6.sin6_scope_id;
        local_240.type_ = ipv6;
        local_240.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      }
      asio::ip::address::to_string_abi_cxx11_(&local_1f8,&local_240);
      if ((int)(this->super_DeliveryCommonData).Logger.ChannelMinLevel < 2) {
        swap_bytes(local_21c.v4.sin_port);
        local_1b8._0_8_ = (this->super_DeliveryCommonData).Logger.ChannelName;
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._8_4_ = Debug;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(this->super_DeliveryCommonData).Logger.Prefix._M_dataplus._M_p
                   ,(this->super_DeliveryCommonData).Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Inject: Set client address to ",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," : ",3);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
LAB_00109cbf:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
    }
    else {
      if ((in_port_t)(local_21c.v4.sin_port << 8 | local_21c.v4.sin_port >> 8) == sourcePort) {
        DeliveryChannel::InsertQueueNode(&this->C2S,node);
        goto LAB_00109cee;
      }
      if (local_21c.base.sa_family == 2) {
        local_240._0_8_ = (ulong)local_21c.v6.sin6_flowinfo << 0x20;
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
        local_240.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_240.ipv6_address_.scope_id_ = 0;
      }
      else {
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = local_21c.base.sa_data[6];
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = local_21c.base.sa_data[7];
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = local_21c.base.sa_data[8];
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = local_21c.base.sa_data[9];
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = local_21c.base.sa_data[10];
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = local_21c.base.sa_data[0xb];
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = local_21c.base.sa_data[0xc];
        local_240.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = local_21c.base.sa_data[0xd];
        local_240.ipv6_address_.addr_.__in6_u._8_8_ = local_21c._16_8_;
        local_240.ipv6_address_.scope_id_ = (unsigned_long)local_21c.v6.sin6_scope_id;
        local_240.type_ = ipv6;
        local_240.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      }
      asio::ip::address::to_string_abi_cxx11_(&local_1f8,&local_240);
      if ((int)(this->super_DeliveryCommonData).Logger.ChannelMinLevel < 4) {
        swap_bytes(local_21c.v4.sin_port);
        local_1b8._0_8_ = (this->super_DeliveryCommonData).Logger.ChannelName;
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(this->super_DeliveryCommonData).Logger.Prefix._M_dataplus._M_p
                   ,(this->super_DeliveryCommonData).Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Inject: Ignored data from unrecognized source address ",0x36);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," : ",3);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
        goto LAB_00109cbf;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
  }
LAB_00109cee:
  MVar5 = Mau_Success;
  __mutex_00 = local_200;
LAB_00109cf5:
  pthread_mutex_unlock(__mutex_00);
  return MVar5;
}

Assistant:

MauResult ProxySession::Inject(
    uint16_t sourcePort, ///< [in] Source port
    const void* datagram, ///< [in] Datagram buffer
    unsigned bytes) ///< [in] Datagram bytes
{
    Locker locker(APILock);

    if (Terminated) {
        return Mau_Success;
    }

    if (bytes > ProxyConfig.MaxDatagramBytes) {
        MAU_DEBUG_BREAK();
        return Mau_InvalidInput;
    }
    uint8_t* readBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + bytes);

    QueueNode* queueNode = reinterpret_cast<QueueNode*>(readBuffer);
    queueNode->Bytes = bytes;
    memcpy(&queueNode->Data[0], datagram, bytes);

    const UDPAddress serverAddress = ServerAddress.Get();
    if (sourcePort == serverAddress.port()) {
        S2C.InsertQueueNode(queueNode);
    }
    else
    {
        UDPAddress clientAddress = ClientAddress.Get();
        if (clientAddress.port() == 0)
        {
            clientAddress = UDPAddress(asio::ip::address_v4::loopback(), sourcePort);
            ClientAddress.Set(clientAddress);
            S2C.SetDeliveryAddress(clientAddress);

            C2S.InsertQueueNode(queueNode);

            Logger.Debug("Inject: Set client address to ", clientAddress.address().to_string(), " : ", clientAddress.port());
        }
        else if (clientAddress.port() == sourcePort) {
            C2S.InsertQueueNode(queueNode);
        }
        else {
            Logger.Warning("Inject: Ignored data from unrecognized source address ", clientAddress.address().to_string(), " : ", clientAddress.port());
        }
    }

    return Mau_Success;
}